

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureShadowTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::Texture2DShadowCase::init(Texture2DShadowCase *this,EVP_PKEY_CTX *ctx)

{
  vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_> *this_00;
  float fVar1;
  deUint32 dVar2;
  int iVar3;
  long lVar4;
  undefined4 uVar5;
  Texture2DShadowCase *pTVar6;
  int extraout_EAX;
  Texture2D *pTVar7;
  ulong uVar8;
  RenderTarget *pRVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  pointer ppTVar13;
  long lVar14;
  float fVar15;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint uVar18;
  deUint32 step;
  uint local_158;
  uint uStack_150;
  uint uStack_14c;
  RGBA local_138;
  RGBA local_134;
  Texture2DShadowCase *local_130;
  float local_128 [2];
  undefined8 uStack_120;
  undefined1 local_118 [32];
  Vec4 local_f8;
  undefined8 uStack_e8;
  undefined4 local_e0;
  undefined4 local_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined4 local_c8;
  uint local_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined8 local_94;
  undefined8 uStack_8c;
  undefined8 local_84;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined4 local_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  
  this_00 = &this->m_textures;
  local_130 = this;
  std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::reserve(this_00,2);
  pTVar7 = (Texture2D *)operator_new(0x70);
  glu::Texture2D::Texture2D
            (pTVar7,((this->super_TestCase).m_context)->m_renderCtx,this->m_format,this->m_width,
             this->m_height);
  local_f8.m_data._0_8_ = pTVar7;
  std::vector<glu::Texture2D*,std::allocator<glu::Texture2D*>>::emplace_back<glu::Texture2D*>
            ((vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *)this_00,
             (Texture2D **)&local_f8);
  pTVar7 = (Texture2D *)operator_new(0x70);
  glu::Texture2D::Texture2D
            (pTVar7,((this->super_TestCase).m_context)->m_renderCtx,this->m_format,this->m_width,
             this->m_height);
  local_f8.m_data._0_8_ = pTVar7;
  std::vector<glu::Texture2D*,std::allocator<glu::Texture2D*>>::emplace_back<glu::Texture2D*>
            ((vector<glu::Texture2D*,std::allocator<glu::Texture2D*>> *)this_00,
             (Texture2D **)&local_f8);
  pTVar7 = *(this_00->super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((long)(pTVar7->m_refTexture).super_TextureLevelPyramid.m_access.
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           *(long *)&(pTVar7->m_refTexture).super_TextureLevelPyramid.m_access.
                     super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                     ._M_impl >> 3) * -0x3333333333333333;
  uVar18 = (uint)uVar8;
  if (0 < (int)uVar18) {
    lVar14 = 0;
    uVar12 = 0;
    do {
      tcu::Texture2D::allocLevel
                (&(*(this_00->
                    super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>)._M_impl
                    .super__Vector_impl_data._M_start)->m_refTexture,(int)uVar12);
      local_f8.m_data._0_8_ = (Texture2D *)0xbf000000bf000000;
      local_f8.m_data[2] = -0.5;
      local_f8.m_data[3] = 2.0;
      local_118._0_8_ = (Texture2D *)0x3f8000003f800000;
      local_118._8_4_ = 1.0;
      local_118._12_4_ = 0.0;
      tcu::fillWithComponentGradients
                ((PixelBufferAccess *)
                 (*(long *)&((*(this_00->
                               super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>
                               )._M_impl.super__Vector_impl_data._M_start)->m_refTexture).
                            super_TextureLevelPyramid.m_access.
                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                            ._M_impl + lVar14),&local_f8,(Vec4 *)local_118);
      uVar12 = uVar12 + 1;
      lVar14 = lVar14 + 0x28;
    } while ((uVar18 & 0x7fffffff) != uVar12);
    if (0 < (int)uVar18) {
      lVar14 = 0;
      local_128[0] = (float)(0xffffff / (uVar8 & 0xffffffff));
      uVar8 = 0;
      do {
        tcu::Texture2D::allocLevel
                  (&(this_00->
                    super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>)._M_impl
                    .super__Vector_impl_data._M_start[1]->m_refTexture,(int)uVar8);
        uVar11 = (int)local_128[0] * (int)uVar8;
        local_134.m_value = uVar11 | 0xff000000;
        lVar4 = *(long *)&((this_00->
                           super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>).
                           _M_impl.super__Vector_impl_data._M_start[1]->m_refTexture).
                          super_TextureLevelPyramid.m_access.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl;
        tcu::RGBA::toVec(&local_134);
        local_138.m_value = ~uVar11 | 0xff000000;
        tcu::RGBA::toVec(&local_138);
        tcu::fillWithGrid((PixelBufferAccess *)(lVar4 + lVar14),4,&local_f8,(Vec4 *)local_118);
        uVar8 = uVar8 + 1;
        lVar14 = lVar14 + 0x28;
      } while ((uVar18 & 0x7fffffff) != uVar8);
    }
  }
  pTVar6 = local_130;
  for (ppTVar13 = (local_130->m_textures).
                  super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      ppTVar13 !=
      (pTVar6->m_textures).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppTVar13 = ppTVar13 + 1) {
    (*(*ppTVar13)->_vptr_Texture2D[2])();
  }
  dVar2 = pTVar6->m_compareFunc;
  if (dVar2 == 0x205 || dVar2 == 0x202) {
    local_c4 = 0x3f800000;
  }
  else {
    local_c4 = 0x3f000000;
  }
  local_dc = 0;
  if (dVar2 != 0x205 && dVar2 != 0x202) {
    local_dc = 0x3f000000;
  }
  local_f8.m_data._0_8_ = (ulong)local_c4 << 0x20;
  local_f8.m_data[2] = 1.6;
  local_f8.m_data[3] = 2.9;
  uStack_e8 = 0xc02ccccdbf800000;
  local_e0 = 0;
  local_d8 = 0xbfaccccdc0000000;
  uStack_d0 = 0x3f333333be4ccccd;
  local_c8 = 1;
  local_c0 = 0x3e8ccccd3e0f5c29;
  uStack_b8 = 0xbf8ccccdbfc00000;
  local_b0 = 1;
  local_a8 = 0xc028f5c3bf6b851f;
  uStack_a0 = 0xbdcccccd3ecccccd;
  local_98 = 1;
  local_94 = 0xbec7ae143f8ccccd;
  uStack_8c = 0x3f266666bf051eb8;
  local_84 = 0x13f5eb852;
  local_7c = 0xbfc66666bdcccccd;
  uStack_74 = 0x3eb333333f266666;
  local_6c = 0x3f68f5c3;
  local_ac = local_dc;
  pRVar9 = Context::getRenderTarget((pTVar6->super_TestCase).m_context);
  uVar5 = pRVar9->m_width;
  lVar14._0_4_ = (pRVar9->m_pixelFormat).redBits;
  lVar14._4_4_ = (pRVar9->m_pixelFormat).greenBits;
  pRVar9 = Context::getRenderTarget((pTVar6->super_TestCase).m_context);
  uVar18 = -(uint)(pRVar9->m_height < 0x40);
  local_68 = (float)(int)(~-(uint)((int)uVar5 < 0x40) & 0x40 | uVar5 & -(uint)((int)uVar5 < 0x40));
  fStack_64 = (float)(int)(~uVar18 & 0x40 | pRVar9->m_height & uVar18);
  fStack_60 = (float)(int)((undefined4)lVar14 & -(uint)((int)(undefined4)lVar14 < 0));
  fStack_5c = (float)(int)(lVar14._4_4_ & -(uint)(lVar14 < 0));
  lVar14 = 0x10;
  do {
    iVar3 = *(int *)(local_118 + lVar14 + 0x10);
    ppTVar13 = (pTVar6->m_textures).
               super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    iVar10 = (int)((ulong)((long)(pTVar6->m_textures).
                                 super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar13) >> 3)
             + -1;
    if (iVar3 < iVar10) {
      iVar10 = iVar3;
    }
    if (iVar3 < 0) {
      iVar10 = 0;
    }
    fVar1 = *(float *)(local_118 + lVar14 + 0x14);
    fVar15 = *(float *)(local_118 + lVar14 + 0x1c);
    local_58 = expf(*(float *)(local_118 + lVar14 + 0x18) * 0.6931472);
    fStack_54 = extraout_XMM0_Db;
    uStack_50 = extraout_XMM0_Dc;
    uStack_4c = extraout_XMM0_Dd;
    pTVar7 = ppTVar13[iVar10];
    local_128 = *(float (*) [2])((long)local_f8.m_data + lVar14);
    uStack_120 = 0;
    local_48 = ZEXT416((uint)(pTVar7->m_refTexture).m_width);
    fVar15 = expf(fVar15 * 0.6931472);
    auVar16._0_4_ = local_58 * local_68;
    auVar16._4_4_ = fVar15 * fStack_64;
    auVar16._8_4_ = fStack_54 * fStack_60;
    auVar16._12_4_ = extraout_XMM0_Db_00 * fStack_5c;
    auVar17._0_4_ = (float)(int)local_48._0_4_;
    auVar17._4_4_ = (float)(pTVar7->m_refTexture).m_height;
    auVar17._8_4_ = (float)(int)local_48._4_4_;
    auVar17._12_4_ = 0;
    auVar17 = divps(auVar16,auVar17);
    local_118._16_4_ = auVar17._0_4_ + local_128[0];
    local_118._20_4_ = auVar17._4_4_ + local_128[1];
    local_118._8_4_ = local_128[0];
    local_118._12_4_ = local_128[1];
    local_118._0_8_ = pTVar7;
    local_118._24_4_ = fVar1;
    std::
    vector<deqp::gles3::Functional::Texture2DShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture2DShadowCase::FilterCase>_>
    ::emplace_back<deqp::gles3::Functional::Texture2DShadowCase::FilterCase>
              (&pTVar6->m_cases,(FilterCase *)local_118);
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0xa0);
  pTVar6->m_caseNdx = 0;
  tcu::TestContext::setTestResult
            ((pTVar6->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return extraout_EAX;
}

Assistant:

void Texture2DShadowCase::init (void)
{
	try
	{
		// Create 2 textures.
		m_textures.reserve(2);
		m_textures.push_back(new glu::Texture2D(m_context.getRenderContext(), m_format, m_width, m_height));
		m_textures.push_back(new glu::Texture2D(m_context.getRenderContext(), m_format, m_width, m_height));

		int numLevels = m_textures[0]->getRefTexture().getNumLevels();

		// Fill first gradient texture.
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			m_textures[0]->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithComponentGradients(m_textures[0]->getRefTexture().getLevel(levelNdx), tcu::Vec4(-0.5f, -0.5f, -0.5f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f));
		}

		// Fill second with grid texture.
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			deUint32	step	= 0x00ffffff / numLevels;
			deUint32	rgb		= step*levelNdx;
			deUint32	colorA	= 0xff000000 | rgb;
			deUint32	colorB	= 0xff000000 | ~rgb;

			m_textures[1]->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithGrid(m_textures[1]->getRefTexture().getLevel(levelNdx), 4, tcu::RGBA(colorA).toVec(), tcu::RGBA(colorB).toVec());
		}

		// Upload.
		for (std::vector<glu::Texture2D*>::iterator i = m_textures.begin(); i != m_textures.end(); i++)
			(*i)->upload();
	}
	catch (const std::exception&)
	{
		// Clean up to save memory.
		Texture2DShadowCase::deinit();
		throw;
	}

	// Compute cases.
	{
		const float refInRangeUpper		= (m_compareFunc == GL_EQUAL || m_compareFunc == GL_NOTEQUAL) ? 1.0f : 0.5f;
		const float refInRangeLower		= (m_compareFunc == GL_EQUAL || m_compareFunc == GL_NOTEQUAL) ? 0.0f : 0.5f;
		const float refOutOfBoundsUpper	= 1.1f;		// !< lookup function should clamp values to [0, 1] range
		const float refOutOfBoundsLower	= -0.1f;

		const struct
		{
			int		texNdx;
			float	ref;
			float	lodX;
			float	lodY;
			float	oX;
			float	oY;
		} cases[] =
		{
			{ 0,	refInRangeUpper,		1.6f,	2.9f,	-1.0f,	-2.7f	},
			{ 0,	refInRangeLower,		-2.0f,	-1.35f,	-0.2f,	0.7f	},
			{ 1,	refInRangeUpper,		0.14f,	0.275f,	-1.5f,	-1.1f	},
			{ 1,	refInRangeLower,		-0.92f,	-2.64f,	0.4f,	-0.1f	},
			{ 1,	refOutOfBoundsUpper,	-0.39f,	-0.52f,	0.65f,	0.87f	},
			{ 1,	refOutOfBoundsLower,	-1.55f,	0.65f,	0.35f,	0.91f	},
		};

		const float	viewportW	= (float)de::min<int>(TEX2D_VIEWPORT_WIDTH, m_context.getRenderTarget().getWidth());
		const float	viewportH	= (float)de::min<int>(TEX2D_VIEWPORT_HEIGHT, m_context.getRenderTarget().getHeight());

		for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
		{
			const int	texNdx	= de::clamp(cases[caseNdx].texNdx, 0, (int)m_textures.size()-1);
			const float ref		= cases[caseNdx].ref;
			const float	lodX	= cases[caseNdx].lodX;
			const float	lodY	= cases[caseNdx].lodY;
			const float	oX		= cases[caseNdx].oX;
			const float	oY		= cases[caseNdx].oY;
			const float	sX		= deFloatExp2(lodX)*viewportW / float(m_textures[texNdx]->getRefTexture().getWidth());
			const float	sY		= deFloatExp2(lodY)*viewportH / float(m_textures[texNdx]->getRefTexture().getHeight());

			m_cases.push_back(FilterCase(m_textures[texNdx], ref, tcu::Vec2(oX, oY), tcu::Vec2(oX+sX, oY+sY)));
		}
	}

	m_caseNdx = 0;
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}